

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_81(QPDF *pdf,char *arg2)

{
  BaseHandle local_20;
  
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::getIntValue();
  qpdf::BaseHandle::~BaseHandle(&local_20);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xb10,"void test_81(QPDF &, const char *)");
}

Assistant:

static void
test_81(QPDF& pdf, char const* arg2)
{
    // Exercise that type errors get their own special type
    try {
        QPDFObjectHandle::newNull().getIntValue();
        assert(false);
    } catch (QPDFExc& e) {
        assert(e.getErrorCode() == qpdf_e_object);
    }
}